

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  long lVar2;
  PCache *pCache;
  sqlite3_file *psVar3;
  sqlite3_io_methods *psVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Btree *p;
  BtShared *p_00;
  Pager *pPVar11;
  ulong uVar12;
  void *pvVar13;
  sqlite3_mutex *psVar14;
  sqlite3_mutex *psVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  Btree *pBVar19;
  code *pcVar20;
  Btree *pBVar21;
  char *pcVar22;
  Btree *pBVar23;
  Btree *pBVar24;
  Btree **ppBVar25;
  BtShared **ppBVar26;
  u8 uVar27;
  byte bVar28;
  bool bVar29;
  bool bVar30;
  char *local_108;
  uint local_fc;
  sqlite3_mutex *local_f8;
  char *local_e0;
  byte local_d4;
  u8 local_d0;
  char *local_c8;
  uint local_9c;
  uchar zDbHeader [100];
  
  if (zFilename == (char *)0x0) {
LAB_0011d22e:
    bVar29 = true;
    if (db->temp_store != '\x02') goto LAB_0011d245;
LAB_0011d238:
    local_fc = flags | 2;
    uVar16 = 1;
  }
  else {
    cVar1 = *zFilename;
    bVar29 = cVar1 == '\0';
    iVar5 = strcmp(zFilename,":memory:");
    if (iVar5 == 0) goto LAB_0011d238;
    if (cVar1 == '\0') goto LAB_0011d22e;
    bVar29 = false;
LAB_0011d245:
    uVar16 = (vfsFlags & 0x80U) >> 7;
    local_fc = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar10 = vfsFlags & 0xfffffcffU | 0x200;
  if (uVar16 == 0 && !bVar29) {
    uVar10 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar10 = vfsFlags;
  }
  p = (Btree *)sqlite3MallocZero(0x48);
  iVar5 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->inTrans = '\0';
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  local_d4 = (byte)uVar16;
  if ((!bVar29) && ((uVar10 >> 0x11 & 1) != 0 && ((uVar10 & 0x40) == 0 & local_d4) == 0)) {
    iVar9 = sqlite3Strlen30(zFilename);
    uVar7 = iVar9 + 1;
    uVar6 = pVfs->mxPathname + 1;
    uVar16 = uVar7;
    if ((int)uVar7 < (int)uVar6) {
      uVar16 = uVar6;
    }
    pcVar22 = (char *)sqlite3Malloc((ulong)uVar16);
    p->sharable = '\x01';
    if (pcVar22 != (char *)0x0) {
      if (local_d4 == 0) {
        *pcVar22 = '\0';
        iVar5 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar6,pcVar22);
        if (iVar5 != 0) {
          sqlite3_free(pcVar22);
          goto LAB_0011d4f8;
        }
      }
      else {
        memcpy(pcVar22,zFilename,(ulong)uVar7);
      }
      bVar29 = true;
      if (sqlite3Config.bCoreMutex == 0) {
        psVar14 = (sqlite3_mutex *)0x0;
        bVar30 = true;
        local_f8 = (sqlite3_mutex *)0x0;
      }
      else {
        local_f8 = (*sqlite3Config.mutex.xMutexAlloc)(4);
        bVar30 = local_f8 == (sqlite3_mutex *)0x0;
        if (!bVar30) {
          (*sqlite3Config.mutex.xMutexEnter)(local_f8);
        }
        if ((sqlite3Config.bCoreMutex == 0) ||
           (psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar14 == (sqlite3_mutex *)0x0)) {
          psVar14 = (sqlite3_mutex *)0x0;
        }
        else {
          (*sqlite3Config.mutex.xMutexEnter)(psVar14);
          bVar29 = false;
        }
      }
      ppBVar26 = &sqlite3SharedCacheList;
LAB_0011d82b:
      p_00 = *ppBVar26;
      if (p_00 != (BtShared *)0x0) {
        pPVar11 = p_00->pPager;
        iVar5 = strcmp(pcVar22,pPVar11->zFilename);
        if ((iVar5 != 0) || (pPVar11->pVfs != pVfs)) goto LAB_0011d855;
        uVar12 = (ulong)(uint)db->nDb;
        lVar17 = uVar12 * 0x20 + -0x18;
        for (; 0 < (int)uVar12; uVar12 = (ulong)((int)uVar12 - 1)) {
          lVar2 = *(long *)((long)&db->aDb->zDbSName + lVar17);
          if ((lVar2 != 0) && (*(BtShared **)(lVar2 + 8) == p_00)) {
            if (!bVar29) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar14);
            }
            if (!bVar30) {
              (*sqlite3Config.mutex.xMutexLeave)(local_f8);
            }
            sqlite3_free(pcVar22);
            sqlite3_free(p);
            return 0x13;
          }
          lVar17 = lVar17 + -0x20;
        }
        p->pBt = p_00;
        p_00->nRef = p_00->nRef + 1;
      }
      if (!bVar29) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar14);
      }
      sqlite3_free(pcVar22);
      if (p_00 == (BtShared *)0x0) goto LAB_0011d2db;
      goto LAB_0011d8cc;
    }
LAB_0011d4f8:
    sqlite3_free(p);
    return iVar5;
  }
  local_f8 = (sqlite3_mutex *)0x0;
LAB_0011d2db:
  p_00 = (BtShared *)sqlite3MallocZero(0x88);
  if (p_00 == (BtShared *)0x0) {
    iVar5 = 7;
  }
  else {
    zDbHeader[0] = '\0';
    zDbHeader[1] = '\x10';
    zDbHeader[2] = '\0';
    zDbHeader[3] = '\0';
    iVar9 = 0x58;
    if (0x58 < pVfs->szOsFile) {
      iVar9 = pVfs->szOsFile;
    }
    p_00->pPager = (Pager *)0x0;
    uVar16 = local_fc & 2;
    local_c8 = zFilename;
    if (uVar16 == 0) {
      if (zFilename == (char *)0x0) {
        local_c8 = (char *)0x0;
        bVar29 = true;
LAB_0011d5c9:
        local_d0 = '\0';
        goto LAB_0011d5e9;
      }
      if (*zFilename == '\0') {
        bVar29 = false;
        goto LAB_0011d5c9;
      }
      iVar5 = pVfs->mxPathname;
      local_108 = (char *)sqlite3Malloc((long)iVar5 * 2 + 2);
      if (local_108 == (char *)0x0) {
LAB_0011d56d:
        iVar5 = 7;
      }
      else {
        *local_108 = '\0';
        iVar5 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar5 + 1,local_108);
        uVar6 = sqlite3Strlen30(local_108);
        uVar7 = sqlite3Strlen30(zFilename);
        local_e0 = zFilename + (ulong)uVar7 + 1;
        for (pcVar22 = local_e0; *pcVar22 != '\0';
            pcVar22 = pcVar22 + (ulong)uVar8 + (ulong)uVar7 + 2) {
          uVar7 = sqlite3Strlen30(pcVar22);
          uVar8 = sqlite3Strlen30(pcVar22 + (ulong)uVar7 + 1);
        }
        if (iVar5 == 0) {
          if ((int)(uVar6 + 8) <= pVfs->mxPathname) {
            iVar5 = ((int)pcVar22 - (int)local_e0) + 1;
            bVar29 = false;
            local_d0 = '\0';
            goto LAB_0011d5ff;
          }
          iVar5 = sqlite3CantopenError(0xc907);
        }
        sqlite3_free(local_108);
      }
    }
    else {
      if (zFilename == (char *)0x0) {
        local_d0 = '\x01';
        local_c8 = (char *)0x0;
        bVar29 = true;
LAB_0011d5e9:
        local_108 = (char *)0x0;
        uVar6 = 0;
        local_e0 = (char *)0x0;
        iVar5 = 0;
      }
      else {
        if (*zFilename == '\0') {
          local_d0 = '\x01';
          bVar29 = false;
          goto LAB_0011d5e9;
        }
        iVar5 = 0;
        local_108 = sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
        if (local_108 == (char *)0x0) goto LAB_0011d56d;
        uVar6 = sqlite3Strlen30(local_108);
        bVar29 = true;
        local_c8 = (char *)0x0;
        local_d0 = '\x01';
        local_e0 = (char *)0x0;
      }
LAB_0011d5ff:
      uVar12 = (ulong)uVar6;
      uVar18 = (ulong)(iVar9 + 7U & 0x7ffffff8);
      pPVar11 = (Pager *)sqlite3MallocZero(((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) +
                                           uVar12 * 3 + uVar18 * 2 + (long)iVar5 + 0x189);
      if (pPVar11 == (Pager *)0x0) {
        sqlite3DbFree((sqlite3 *)0x0,local_108);
        iVar5 = 7;
      }
      else {
        pPVar11->pPCache = (PCache *)(pPVar11 + 1);
        pPVar11->fd = (sqlite3_file *)&pPVar11[1].fd;
        pcVar22 = pPVar11[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40);
        pPVar11->sjfd = (sqlite3_file *)pcVar22;
        pPVar11->jfd = (sqlite3_file *)(pcVar22 + uVar18);
        pcVar22 = pcVar22 + uVar18 + uVar18;
        pPVar11->zFilename = pcVar22;
        if (local_108 != (char *)0x0) {
          pPVar11->zJournal = pcVar22 + (int)(uVar6 + iVar5 + 1);
          memcpy(pcVar22,local_108,uVar12);
          if (iVar5 != 0) {
            memcpy(pPVar11->zFilename + (uVar6 + 1),local_e0,(long)iVar5);
          }
          memcpy(pPVar11->zJournal,local_108,uVar12);
          builtin_strncpy(pPVar11->zJournal + uVar12,"-journal",9);
          (pPVar11->zJournal + uVar12 + 8)[1] = '\0';
          pPVar11->zWal = pPVar11->zJournal + uVar12 + 9;
          memcpy(pPVar11->zJournal + uVar12 + 9,local_108,uVar12);
          builtin_strncpy(pPVar11->zWal + uVar12,"-wal",5);
          sqlite3_free(local_108);
        }
        pPVar11->pVfs = pVfs;
        pPVar11->vfsFlags = uVar10;
        if ((bVar29) || (*local_c8 == '\0')) {
LAB_0011da5f:
          pPVar11->eState = '\x01';
          pPVar11->eLock = '\x04';
          pPVar11->noLock = '\x01';
          bVar28 = (byte)uVar10 & 1;
          uVar27 = '\x01';
          bVar29 = false;
LAB_0011da72:
          iVar5 = sqlite3PagerSetPagesize(pPVar11,(u32 *)zDbHeader,-1);
          if (iVar5 == 0) {
            pcVar20 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar16 == 0) {
              pcVar20 = pagerStress;
            }
            pCache = pPVar11->pPCache;
            pCache->szSpill = 0;
            pCache->szPage = 0;
            pCache->szExtra = 0;
            pCache->bPurgeable = '\0';
            pCache->eCreate = '\0';
            *(undefined2 *)&pCache->field_0x2e = 0;
            pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pCache->pStress = (void *)0x0;
            pCache->pSynced = (PgHdr *)0x0;
            pCache->nRefSum = 0;
            pCache->szCache = 0;
            pCache->pDirty = (PgHdr *)0x0;
            pCache->pDirtyTail = (PgHdr *)0x0;
            pCache->pCache = (sqlite3_pcache *)0x0;
            pCache->szExtra = 0x88;
            pCache->bPurgeable = (byte)(uVar16 >> 1) ^ 1;
            pCache->eCreate = '\x02';
            pCache->xStress = pcVar20;
            pCache->pStress = pPVar11;
            pCache->szCache = 100;
            pCache->szSpill = 1;
            pCache->szPage = 1;
            iVar5 = sqlite3PcacheSetPageSize(pCache,zDbHeader._0_4_);
            if (iVar5 == 0) {
              pPVar11->useJournal = (byte)(local_fc & 1) ^ 1;
              pPVar11->mxPgno = 0x3fffffff;
              pPVar11->tempFile = uVar27;
              pPVar11->exclusiveMode = uVar27;
              pPVar11->changeCountDone = uVar27;
              pPVar11->memDb = local_d0;
              pPVar11->readOnly = bVar28;
              pPVar11->noSync = uVar27;
              if (bVar29) {
                pPVar11->syncFlags = '\x02';
                pPVar11->fullSync = '\x01';
                pPVar11->extraSync = '\0';
                pPVar11->ckptSyncFlags = '\x02';
                pPVar11->walSyncFlags = '\"';
              }
              pPVar11->nExtra = 0x88;
              pPVar11->journalSizeLimit = -1;
              setSectorSize(pPVar11);
              if ((local_fc & 3) != 0) {
                pPVar11->journalMode = ((local_fc & 1) == 0) * '\x02' + '\x02';
              }
              pPVar11->xReiniter = pageReinit;
              setGetterMethod(pPVar11);
              p_00->pPager = pPVar11;
              pPVar11->szMmap = db->szMmap;
              pagerFixMaplimit(pPVar11);
              zDbHeader[0x50] = '\0';
              zDbHeader[0x51] = '\0';
              zDbHeader[0x52] = '\0';
              zDbHeader[0x53] = '\0';
              zDbHeader[0x54] = '\0';
              zDbHeader[0x55] = '\0';
              zDbHeader[0x56] = '\0';
              zDbHeader[0x57] = '\0';
              zDbHeader[0x58] = '\0';
              zDbHeader[0x59] = '\0';
              zDbHeader[0x5a] = '\0';
              zDbHeader[0x5b] = '\0';
              zDbHeader[0x5c] = '\0';
              zDbHeader[0x5d] = '\0';
              zDbHeader[0x5e] = '\0';
              zDbHeader[0x5f] = '\0';
              zDbHeader[0x40] = '\0';
              zDbHeader[0x41] = '\0';
              zDbHeader[0x42] = '\0';
              zDbHeader[0x43] = '\0';
              zDbHeader[0x44] = '\0';
              zDbHeader[0x45] = '\0';
              zDbHeader[0x46] = '\0';
              zDbHeader[0x47] = '\0';
              zDbHeader[0x48] = '\0';
              zDbHeader[0x49] = '\0';
              zDbHeader[0x4a] = '\0';
              zDbHeader[0x4b] = '\0';
              zDbHeader[0x4c] = '\0';
              zDbHeader[0x4d] = '\0';
              zDbHeader[0x4e] = '\0';
              zDbHeader[0x4f] = '\0';
              zDbHeader[0x30] = '\0';
              zDbHeader[0x31] = '\0';
              zDbHeader[0x32] = '\0';
              zDbHeader[0x33] = '\0';
              zDbHeader[0x34] = '\0';
              zDbHeader[0x35] = '\0';
              zDbHeader[0x36] = '\0';
              zDbHeader[0x37] = '\0';
              zDbHeader[0x38] = '\0';
              zDbHeader[0x39] = '\0';
              zDbHeader[0x3a] = '\0';
              zDbHeader[0x3b] = '\0';
              zDbHeader[0x3c] = '\0';
              zDbHeader[0x3d] = '\0';
              zDbHeader[0x3e] = '\0';
              zDbHeader[0x3f] = '\0';
              zDbHeader[0x20] = '\0';
              zDbHeader[0x21] = '\0';
              zDbHeader[0x22] = '\0';
              zDbHeader[0x23] = '\0';
              zDbHeader[0x24] = '\0';
              zDbHeader[0x25] = '\0';
              zDbHeader[0x26] = '\0';
              zDbHeader[0x27] = '\0';
              zDbHeader[0x28] = '\0';
              zDbHeader[0x29] = '\0';
              zDbHeader[0x2a] = '\0';
              zDbHeader[0x2b] = '\0';
              zDbHeader[0x2c] = '\0';
              zDbHeader[0x2d] = '\0';
              zDbHeader[0x2e] = '\0';
              zDbHeader[0x2f] = '\0';
              zDbHeader[0x10] = '\0';
              zDbHeader[0x11] = '\0';
              zDbHeader[0x12] = '\0';
              zDbHeader[0x13] = '\0';
              zDbHeader[0x14] = '\0';
              zDbHeader[0x15] = '\0';
              zDbHeader[0x16] = '\0';
              zDbHeader[0x17] = '\0';
              zDbHeader[0x18] = '\0';
              zDbHeader[0x19] = '\0';
              zDbHeader[0x1a] = '\0';
              zDbHeader[0x1b] = '\0';
              zDbHeader[0x1c] = '\0';
              zDbHeader[0x1d] = '\0';
              zDbHeader[0x1e] = '\0';
              zDbHeader[0x1f] = '\0';
              zDbHeader[0x60] = '\0';
              zDbHeader[0x61] = '\0';
              zDbHeader[0x62] = '\0';
              zDbHeader[99] = '\0';
              zDbHeader[0] = '\0';
              zDbHeader[1] = '\0';
              zDbHeader[2] = '\0';
              zDbHeader[3] = '\0';
              zDbHeader[4] = '\0';
              zDbHeader[5] = '\0';
              zDbHeader[6] = '\0';
              zDbHeader[7] = '\0';
              zDbHeader[8] = '\0';
              zDbHeader[9] = '\0';
              zDbHeader[10] = '\0';
              zDbHeader[0xb] = '\0';
              zDbHeader[0xc] = '\0';
              zDbHeader[0xd] = '\0';
              zDbHeader[0xe] = '\0';
              zDbHeader[0xf] = '\0';
              psVar3 = p_00->pPager->fd;
              psVar4 = psVar3->pMethods;
              if (((psVar4 == (sqlite3_io_methods *)0x0) ||
                  (iVar5 = (*psVar4->xRead)(psVar3,zDbHeader,100,0), iVar5 == 0x20a)) ||
                 (iVar5 == 0)) {
                p_00->openFlags = (u8)local_fc;
                p_00->db = db;
                pPVar11 = p_00->pPager;
                pPVar11->xBusyHandler = btreeInvokeBusyHandler;
                pPVar11->pBusyHandlerArg = p_00;
                psVar4 = pPVar11->fd->pMethods;
                if (psVar4 != (sqlite3_io_methods *)0x0) {
                  (*psVar4->xFileControl)(pPVar11->fd,0xf,&pPVar11->xBusyHandler);
                  pPVar11 = p_00->pPager;
                }
                p->pBt = p_00;
                p_00->pCursor = (BtCursor *)0x0;
                p_00->pPage1 = (MemPage *)0x0;
                if (pPVar11->readOnly != '\0') {
                  *(byte *)&p_00->btsFlags = (byte)p_00->btsFlags | 1;
                }
                iVar5 = (int)((zDbHeader._16_8_ & 0xff) << 8);
                uVar16 = (uint)zDbHeader[0x11] * 0x10000 + iVar5;
                p_00->pageSize = uVar16;
                if (((iVar5 + (uint)zDbHeader[0x11] * 0x10000) - 0x10001 < 0xffff01ff) ||
                   ((uVar16 + 0x1ffff & uVar16) != 0)) {
                  p_00->pageSize = 0;
                  uVar16 = 0;
                  if (zFilename != (char *)0x0 && local_d4 == 0) {
                    p_00->autoVacuum = '\0';
                    p_00->incrVacuum = '\0';
                    uVar16 = 0;
                  }
                }
                else {
                  uVar16 = (uint)zDbHeader[0x14];
                  p_00->btsFlags = p_00->btsFlags | 2;
                  p_00->autoVacuum = zDbHeader._52_4_ != 0;
                  p_00->incrVacuum = zDbHeader._64_4_ != 0;
                }
                iVar5 = sqlite3PagerSetPagesize(pPVar11,&p_00->pageSize,uVar16);
                if (iVar5 == 0) {
                  p_00->usableSize = p_00->pageSize - uVar16;
                  p_00->nRef = 1;
                  if (p->sharable != '\0') {
                    if (sqlite3Config.bCoreMutex != 0) {
                      psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                      if (sqlite3Config.bCoreMutex != 0) {
                        psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                        p_00->mutex = psVar15;
                        if (psVar15 == (sqlite3_mutex *)0x0) {
                          iVar5 = 7;
                          goto LAB_0011db36;
                        }
                      }
                      if (psVar14 != (sqlite3_mutex *)0x0) {
                        (*sqlite3Config.mutex.xMutexEnter)(psVar14);
                        p_00->pNext = sqlite3SharedCacheList;
                        sqlite3SharedCacheList = p_00;
                        (*sqlite3Config.mutex.xMutexLeave)(psVar14);
                        goto LAB_0011d8cc;
                      }
                    }
                    p_00->pNext = sqlite3SharedCacheList;
                    sqlite3SharedCacheList = p_00;
                  }
LAB_0011d8cc:
                  if (p->sharable != '\0') {
                    uVar18 = 0;
                    uVar12 = (ulong)(uint)db->nDb;
                    if (db->nDb < 1) {
                      uVar12 = uVar18;
                    }
                    for (; uVar12 * 0x20 != uVar18; uVar18 = uVar18 + 0x20) {
                      pBVar24 = *(Btree **)((long)&db->aDb->pBt + uVar18);
                      if ((pBVar24 != (Btree *)0x0) && (pBVar24->sharable != '\0'))
                      goto LAB_0011d90c;
                    }
                  }
                  goto LAB_0011d9ce;
                }
              }
              goto LAB_0011db36;
            }
          }
        }
        else {
          local_9c = 0;
          iVar5 = (*pVfs->xOpen)(pVfs,pPVar11->zFilename,pPVar11->fd,uVar10 & 0x87f7f,
                                 (int *)&local_9c);
          if (iVar5 == 0) {
            uVar6 = local_9c & 1;
            bVar28 = (byte)uVar6;
            uVar10 = (*pPVar11->fd->pMethods->xDeviceCharacteristics)(pPVar11->fd);
            if (uVar6 == 0) {
              setSectorSize(pPVar11);
              uVar6 = pPVar11->sectorSize;
              if (0x1000 < uVar6) {
                if (uVar6 < 0x2001) {
                  zDbHeader[0] = (char)uVar6;
                  zDbHeader[1] = (char)(uVar6 >> 8);
                  zDbHeader[2] = (char)(uVar6 >> 0x10);
                  zDbHeader[3] = (char)(uVar6 >> 0x18);
                }
                else {
                  zDbHeader[0] = '\0';
                  zDbHeader[1] = ' ';
                  zDbHeader[2] = '\0';
                  zDbHeader[3] = '\0';
                }
              }
            }
            iVar5 = sqlite3_uri_boolean(local_c8,"nolock",0);
            pPVar11->noLock = (u8)iVar5;
            if (((uVar10 >> 0xd & 1) != 0) ||
               (iVar5 = sqlite3_uri_boolean(local_c8,"immutable",0), iVar5 != 0)) {
              uVar10 = 1;
              goto LAB_0011da5f;
            }
            bVar29 = true;
            uVar27 = '\0';
            goto LAB_0011da72;
          }
        }
        psVar3 = pPVar11->fd;
        if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar3->pMethods->xClose)(psVar3);
          psVar3->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar11->pTmpSpace);
        sqlite3_free(pPVar11);
      }
    }
LAB_0011db36:
    if (p_00->pPager != (Pager *)0x0) {
      sqlite3PagerClose(p_00->pPager,(sqlite3 *)0x0);
    }
  }
  sqlite3_free(p_00);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
LAB_0011db5f:
  if (local_f8 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_f8);
  }
  return iVar5;
LAB_0011d855:
  ppBVar26 = &p_00->pNext;
  goto LAB_0011d82b;
LAB_0011d90c:
  do {
    pBVar21 = pBVar24;
    pBVar24 = pBVar21->pPrev;
  } while (pBVar21->pPrev != (Btree *)0x0);
  lVar17 = 0x20;
  if (p->pBt < pBVar21->pBt) {
    ppBVar25 = &pBVar21->pPrev;
    pBVar19 = (Btree *)0x0;
    pBVar24 = p;
  }
  else {
    do {
      pBVar23 = pBVar21;
      pBVar24 = pBVar23->pNext;
      if (pBVar24 == (Btree *)0x0) {
        ppBVar25 = &pBVar23->pNext;
        pBVar21 = (Btree *)0x0;
        pBVar19 = pBVar23;
        pBVar24 = p;
        goto LAB_0011d9c3;
      }
      pBVar21 = pBVar24;
    } while (pBVar24->pBt < p->pBt);
    ppBVar25 = &pBVar23->pNext;
    p->pNext = pBVar24;
    lVar17 = 0x28;
    pBVar19 = p;
    pBVar21 = pBVar23;
  }
LAB_0011d9c3:
  *(Btree **)((long)&p->db + lVar17) = pBVar21;
  pBVar24->pPrev = pBVar19;
  *ppBVar25 = p;
LAB_0011d9ce:
  *ppBtree = p;
  iVar5 = 0;
  pvVar13 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar13 == (void *)0x0) {
    sqlite3PagerSetCachesize(p->pBt->pPager,-2000);
  }
  psVar3 = p_00->pPager->fd;
  psVar4 = psVar3->pMethods;
  if (psVar4 != (sqlite3_io_methods *)0x0) {
    (*psVar4->xFileControl)(psVar3,0x1e,&p_00->db);
  }
  goto LAB_0011db5f;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}